

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusConstrainedPOMDPPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
PerseusConstrainedPOMDPPlanner::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusConstrainedPOMDPPlanner *this,
          BeliefSet *S,QFunctionsDiscrete *Q)

{
  undefined1 *this_00;
  value_type vVar1;
  pointer ppJVar2;
  _func_int *p_Var3;
  pointer ppJVar4;
  pointer pvVar5;
  JointBeliefInterface *pJVar6;
  bool bVar7;
  int k;
  ulong uVar8;
  size_t nrS;
  reference pvVar9;
  ostream *poVar10;
  E *this_01;
  uint uVar11;
  PlanningUnitMADPDiscrete *this_02;
  size_t s;
  size_type __n;
  ulong uVar12;
  size_t b;
  size_type __n_00;
  long lVar13;
  ulong uVar14;
  double dVar15;
  reference rVar16;
  int local_3fc;
  size_type local_3c0;
  AlphaVector alpha;
  ValueFunctionPOMDPDiscrete V1;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  logicTable;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  VB;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numberOfImprovements;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  AlphaVector local_2f0;
  vector<double,_std::allocator<double>_> VBalpha;
  VectorSet Gab;
  string local_280;
  _Bvector_base<std::allocator<bool>_> local_260;
  GaoVectorSet Gao;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b0;
  
  VB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  VB.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ppJVar2 = (S->super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = (this->super_AlphaVectorConstrainedPOMDP)._vptr_AlphaVectorConstrainedPOMDP[-3];
  lVar13 = *(long *)(&(this->super_AlphaVectorConstrainedPOMDP).field_0x10 + (long)p_Var3);
  if (lVar13 == 0) {
    lVar13 = *(long *)(&(this->super_AlphaVectorConstrainedPOMDP).field_0x18 + (long)p_Var3);
  }
  ppJVar4 = (S->super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (**(code **)(**(long **)(lVar13 + 0x30) + 0x68))();
  p_Var3 = (this->super_AlphaVectorConstrainedPOMDP)._vptr_AlphaVectorConstrainedPOMDP[-3];
  this_02 = *(PlanningUnitMADPDiscrete **)
             (&(this->super_AlphaVectorConstrainedPOMDP).field_0x10 + (long)p_Var3);
  if (this_02 == (PlanningUnitMADPDiscrete *)0x0) {
    this_02 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorConstrainedPOMDP).field_0x18 + (long)p_Var3);
  }
  nrS = PlanningUnitMADPDiscrete::GetNrStates(this_02);
  __n = (long)ppJVar2 - (long)ppJVar4 >> 3;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&stillNeedToBeImproved,__n,(bool *)&Gao,(allocator_type *)&alpha);
  logicTable.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_4_ = 0;
  logicTable.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  logicTable.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&numberOfImprovements,__n,(value_type_conflict1 *)&Gao,(allocator_type *)&alpha);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(Q->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&Gao);
  V1.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  V1.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  V1.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  AlphaVector::AlphaVector(&alpha,nrS);
  AlphaVectorPlanning::QFunctionsToValueFunction((ValueFunctionPOMDPDiscrete *)&Gao,Q);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign(&V1,&Gao);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&Gao);
  uVar11 = 0;
  while( true ) {
    uVar14 = (ulong)uVar11;
    if (uVar8 <= uVar14) {
      this_00 = &(this->super_AlphaVectorConstrainedPOMDP).field_0x10;
      Perseus::BackupStageLeadIn(&Gao,(Perseus *)this_00,&V1);
      Gab.data_.size_ = 0;
      Gab.data_.data_ = (pointer)0x0;
      Gab.size1_ = 0;
      Gab.size2_ = 0;
      local_3c0 = __n;
      while (local_3c0 != 0) {
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_260,&stillNeedToBeImproved);
        k = Perseus::SampleNotImprovedBeliefIndex
                      ((Perseus *)this_00,(vector<bool,_std::allocator<bool>_> *)&local_260,
                       (int)local_3c0);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_260);
        AlphaVectorConstrainedPOMDP::BeliefBackupQ
                  ((VectorSet *)&local_2f0,&this->super_AlphaVectorConstrainedPOMDP,
                   (S->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[k],&Gao,&V1);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::operator=(&Gab,(matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                          *)&local_2f0);
        boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                  ((unbounded_array<double,_std::allocator<double>_> *)&local_2f0._m_values);
        lVar13 = 0;
        local_3fc = 0;
        for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
          alpha._m_action = (Index)uVar14;
          for (uVar12 = 0; nrS != uVar12; uVar12 = uVar12 + 1) {
            vVar1 = *(value_type *)((long)Gab.data_.data_ + uVar12 * 8 + Gab.size2_ * lVar13);
            pvVar9 = std::vector<double,_std::allocator<double>_>::at
                               (&alpha._m_values,uVar12 & 0xffffffff);
            *pvVar9 = vVar1;
          }
          pJVar6 = (S->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[k];
          dVar15 = (double)(**(code **)(*(long *)((long)&pJVar6->field_0x0 +
                                                 *(long *)((long)*pJVar6 + -0xb8)) + 0x80))
                                     ((long)&pJVar6->field_0x0 + *(long *)((long)*pJVar6 + -0xb8),
                                      &alpha._m_values);
          if (dVar15 < VB.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[k]) {
            BeliefValue::GetMaximizingVector
                      (&local_2f0,S,k,
                       (Q->
                       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar14);
            AlphaVector::operator=(&alpha,&local_2f0);
            AlphaVector::~AlphaVector(&local_2f0);
          }
          bVar7 = AlphaVectorPlanning::VectorIsInValueFunction
                            (&alpha,(__return_storage_ptr__->
                                    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14);
          if (!bVar7) {
            std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                      ((__return_storage_ptr__->
                       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar14,&alpha);
          }
          for (__n_00 = 0; __n != __n_00; __n_00 = __n_00 + 1) {
            rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&stillNeedToBeImproved,__n_00);
            if ((*rVar16._M_p & rVar16._M_mask) != 0) {
              BeliefValue::GetMaximizingVector
                        (&local_2f0,S,(int)__n_00,
                         (__return_storage_ptr__->
                         super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar14);
              AlphaVector::operator=(&alpha,&local_2f0);
              AlphaVector::~AlphaVector(&local_2f0);
              pJVar6 = (S->
                       super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[__n_00];
              dVar15 = (double)(**(code **)(*(long *)((long)&pJVar6->field_0x0 +
                                                     *(long *)((long)*pJVar6 + -0xb8)) + 0x80))
                                         ((long)&pJVar6->field_0x0 +
                                          *(long *)((long)*pJVar6 + -0xb8),&alpha._m_values);
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (logicTable.
                                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar14,__n_00);
              if (((*rVar16._M_p & rVar16._M_mask) != 0) &&
                 (VB.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[__n_00] + -1e-12 <= dVar15)) {
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (logicTable.
                                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14,__n_00);
                *rVar16._M_p = *rVar16._M_p & ~rVar16._M_mask;
                numberOfImprovements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start[__n_00] =
                     numberOfImprovements.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[__n_00] + 1;
              }
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&stillNeedToBeImproved,__n_00);
              if (((*rVar16._M_p & rVar16._M_mask) != 0) &&
                 (uVar8 <= numberOfImprovements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[__n_00])) {
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&stillNeedToBeImproved,__n_00);
                local_3c0 = local_3c0 - 1;
                local_3fc = local_3fc + 1;
                *rVar16._M_p = *rVar16._M_p & ~rVar16._M_mask;
              }
            }
          }
          lVar13 = lVar13 + 8;
        }
        if (-1 < *(int *)&(this->super_AlphaVectorConstrainedPOMDP).field_0x20) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Added vector for ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10," (");
          poVar10 = std::operator<<(poVar10," improved ");
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,local_3fc);
          poVar10 = std::operator<<(poVar10," nrNotImproved: ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,")");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::multi_array(&local_b0,&Gao);
      Perseus::BackupStageLeadOut((Perseus *)this_00,&local_b0);
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::~multi_array(&local_b0);
      boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                (&Gab.data_);
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::~multi_array(&Gao);
      AlphaVector::~AlphaVector(&alpha);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&V1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&numberOfImprovements.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&logicTable);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&stillNeedToBeImproved.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&VBalpha.super__Vector_base<double,_std::allocator<double>_>);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&VB);
      return __return_storage_ptr__;
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
              ((__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar14);
    pvVar5 = (Q->
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pvVar5[uVar14].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_start ==
        *(pointer *)
         ((long)&pvVar5[uVar14].super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                 _M_impl.super__Vector_impl_data + 8)) break;
    BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&Gao,S,pvVar5 + uVar14);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&VB,(vector<double,_std::allocator<double>_> *)&Gao);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&Gao);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::push_back(&logicTable,&stillNeedToBeImproved);
    uVar11 = uVar11 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&Gao);
  poVar10 = std::operator<<((ostream *)
                            (Gao.
                             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                             .
                             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                             .storage_.ordering_.elems + 1),"Empty Q-function for action ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  this_01 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_01,&local_280);
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

QFunctionsDiscrete
PerseusConstrainedPOMDPPlanner::BackupStage(const BeliefSet &S,
                                            const QFunctionsDiscrete &Q) const
{
    vector<vector<double> > VB;
    vector<double>  VBalpha; 
    
    size_t nrB=S.size(),
           nrNotImproved=nrB,
           nrA=GetPU()->GetNrJointActions(),
           nrS=GetPU()->GetNrStates(),
           k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    vector<vector<bool> > logicTable;
    vector<unsigned int> numberOfImprovements(nrB,0);

    QFunctionsDiscrete Q1(Q.size());
    ValueFunctionPOMDPDiscrete V1;
    AlphaVector alpha(nrS);

#if PRUNE_QFUNCTIONS

    for(Index a = 0; a < nrA; ++a)
    {
      Q1[a] = AlphaVectorPlanning::Prune(Q[a]);
    }

    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q1);
#else
    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q);
#endif

    for(Index a = 0; a < nrA; ++a)
    {
        Q1[a].clear();
        if(Q[a].empty())
        {
            stringstream estream;
            estream << "Empty Q-function for action " << a;
            throw E(estream.str());
        }
        VB.push_back(BeliefValue::GetValues(S,Q[a]));
        logicTable.push_back(stillNeedToBeImproved);
    }

    GaoVectorSet Gao=BackupStageLeadIn(V1);

    VectorSet Gab;

    while(nrNotImproved > 0)
    {
        int nrImprovedByGab=0;

        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Gab = BeliefBackupQ(*S[k],Gao,V1);
        for(size_t a = 0; a < nrA; a++)
        {
            alpha.SetAction(a);
            for(size_t s=0;s < nrS;s++)
              alpha.SetValue(Gab(a,s),s);

            // check whether the alphas improve the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[a][k])
            {
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
#if DEBUG_PerseusConstrainedPOMDPPlanner
                cout << "Getting n-1 vector for " << k << endl;
#endif
            }
            
            // add alphas to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);

            for(size_t b=0;b < nrB;b++)
            {
                if(!stillNeedToBeImproved[b])
                    continue;

                alpha=BeliefValue::GetMaximizingVector(S,b,Q1[a]);
                x=S[b]->InnerProduct(alpha.GetValues());

                if(logicTable[a][b] && x >= VB[a][b] - Globals::REWARD_PRECISION)
                {
                    logicTable[a][b] = false;
                    numberOfImprovements[b]++;
                }
                
                if(stillNeedToBeImproved[b] && numberOfImprovements[b] >= nrA)
                {
                    stillNeedToBeImproved[b]=false;
                    nrNotImproved--;
                    nrImprovedByGab++;
                }
            }
        }
        // update which beliefs have been improved

        if(GetVerbose() >= 0)
          cout << "Added vector for " << k << " ("
               << " improved " << nrImprovedByGab << " nrNotImproved: " << nrNotImproved << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}